

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O3

void __thiscall QDialog::adjustPosition(QDialog *this,QWidget *w)

{
  QDialogPrivate *this_00;
  QWidget *this_01;
  QWidgetData *pQVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QWidget *this_02;
  QScreen *pQVar6;
  QPoint *pQVar7;
  QPoint QVar8;
  int extraout_var;
  QMetaType QVar9;
  QWindow *pQVar10;
  int extraout_EDX;
  int iVar11;
  int extraout_var_00;
  int iVar12;
  int iVar13;
  int iVar14;
  anon_union_24_3_e3d07ef4_for_data *paVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  Representation RVar19;
  undefined8 uVar20;
  int i;
  ulong uVar21;
  long in_FS_OFFSET;
  undefined1 auVar22 [16];
  QPoint local_70;
  QMetaType local_68;
  QMetaType local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  byte local_40;
  undefined7 uStack_3f;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDialogPrivate **)&(this->super_QWidget).field_0x8;
  if (QGuiApplicationPrivate::platform_theme != (long *)0x0) {
    (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
              (&local_58,QGuiApplicationPrivate::platform_theme,0x12);
    cVar2 = ::QVariant::toBool();
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (cVar2 != '\0') goto LAB_004d96d6;
  }
  local_70.xp.m_i = 0;
  local_70.yp.m_i = 0;
  if (w == (QWidget *)0x0) {
    pQVar7 = (QPoint *)QDialogPrivate::transientParentWindow(this_00);
    if (pQVar7 == (QPoint *)0x0) goto LAB_004d92bd;
    pQVar6 = (QScreen *)QWindow::screen();
    bVar3 = true;
    this_02 = (QWidget *)0x0;
  }
  else {
    this_02 = QWidget::window(w);
    if (this_02 == (QWidget *)0x0) {
LAB_004d92bd:
      QGuiApplication::primaryScreen();
      QScreen::virtualSiblings();
      if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + -1;
        UNLOCK();
        if (*(int *)local_58.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,8,0x10);
        }
      }
      if ((ulong)local_58._16_8_ < 2) {
        pQVar6 = QWidget::screen(&this->super_QWidget);
      }
      else {
        local_58.shared = (PrivateShared *)QCursor::pos();
        pQVar6 = (QScreen *)QGuiApplication::screenAt((QPoint *)&local_58.shared);
      }
      bVar3 = true;
      this_02 = (QWidget *)0x0;
    }
    else {
      pQVar6 = QWidget::screen(this_02);
      bVar3 = false;
    }
    pQVar7 = (QPoint *)0x0;
  }
  iVar11 = 0;
  if (pQVar6 == (QScreen *)0x0) {
    auVar22 = ZEXT816(0xffffffffffffffff) << 0x40;
  }
  else {
    auVar22 = QScreen::availableGeometry();
  }
  QApplication::topLevelWidgets();
  uVar21 = 0;
  iVar12 = 0;
  do {
    if (0xaaaaaaaaaaaaaaa9 < uVar21) goto LAB_004d93e8;
    this_01 = *(QWidget **)(&DAT_aaaaaaaaaaaaaaaa + uVar21 * 8);
    if ((this_01->data->widget_attributes & 0x8000) != 0) {
      iVar13 = (this_01->data->crect).x1.m_i;
      iVar4 = QWidget::x(this_01);
      iVar13 = iVar13 - iVar4;
      iVar4 = (this_01->data->crect).y1.m_i;
      iVar5 = QWidget::y(this_01);
      iVar4 = iVar4 - iVar5;
      if (iVar11 <= iVar13) {
        iVar11 = iVar13;
      }
      if (iVar12 <= iVar4) {
        iVar12 = iVar4;
      }
    }
    uVar21 = uVar21 + 1;
  } while ((iVar11 == 0) || (iVar12 == 0));
  if ((0x27 < iVar12) || (9 < iVar11)) {
LAB_004d93e8:
    iVar11 = 10;
    iVar12 = 0x28;
  }
  iVar13 = auVar22._0_4_;
  iVar4 = auVar22._4_4_;
  if (bVar3) {
    if (pQVar7 != (QPoint *)0x0) {
      local_58.shared = (PrivateShared *)0x0;
      QVar8 = (QPoint)QWindow::mapToGlobal(pQVar7);
      iVar5 = QWindow::geometry();
      iVar14 = (((extraout_EDX - iVar5) - ((extraout_EDX - iVar5) + 1 >> 0x1f)) + 1 >> 1) +
               QVar8.xp.m_i.m_i;
      QWindow::geometry();
      iVar5 = extraout_var_00 - extraout_var;
      goto LAB_004d95c6;
    }
    iVar5 = auVar22._8_4_ - iVar13;
    iVar14 = ((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1) + iVar13;
    iVar5 = auVar22._12_4_ - iVar4;
    RVar19.m_i = iVar4;
  }
  else {
    pQVar10 = QWidget::windowHandle(this_02);
    if (pQVar10 == (QWindow *)0x0) {
LAB_004d9588:
      local_58.shared = (PrivateShared *)0x0;
      QVar8 = QWidget::mapToGlobal(this_02,(QPoint *)&local_58.shared);
    }
    else {
      QWidget::windowHandle(this_02);
      paVar15 = &local_58;
      QObject::property((char *)paVar15->data);
      local_60.d_ptr =
           (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<unsigned_long_long>::metaType
      ;
      local_68.d_ptr = (QMetaTypeInterface *)(CONCAT71(uStack_3f,local_40) & 0xfffffffffffffffc);
      bVar3 = comparesEqual(&local_68,&local_60);
      if (bVar3) {
        uVar20 = local_58.shared;
        if ((local_40 & 1) != 0) {
          uVar20 = *(QMetaTypeInterface **)
                    (local_58.shared +
                    (int)*(QFlagsStorageHelper<QArrayData::ArrayOption,_4> *)(local_58.shared + 4));
        }
      }
      else {
        local_68.d_ptr = (QMetaTypeInterface *)0x0;
        QVar9.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if ((local_40 & 1) != 0) {
          paVar15 = (anon_union_24_3_e3d07ef4_for_data *)
                    (local_58.shared +
                    (int)*(QFlagsStorageHelper<QArrayData::ArrayOption,_4> *)(local_58.shared + 4));
        }
        QMetaType::convert(QVar9,paVar15,local_60,&local_68);
        uVar20 = local_68.d_ptr;
      }
      ::QVariant::~QVariant((QVariant *)&local_58);
      if ((QMetaTypeInterface *)uVar20 == (QMetaTypeInterface *)0x0) goto LAB_004d9588;
      QVar8 = QWidget::pos(this_02);
    }
    pQVar1 = this_02->data;
    iVar5 = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
    iVar14 = ((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1) + QVar8.xp.m_i.m_i;
    iVar5 = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
LAB_004d95c6:
    RVar19.m_i = QVar8.yp.m_i.m_i;
  }
  iVar5 = (iVar5 + 1) / 2 + RVar19.m_i;
  pQVar1 = (this->super_QWidget).data;
  iVar16 = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
  local_70.xp.m_i = (iVar14 - iVar11) - ((iVar16 - (iVar16 + 1 >> 0x1f)) + 1 >> 1);
  iVar17 = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
  iVar14 = iVar17 + 1;
  iVar17 = (iVar17 - (iVar14 >> 0x1f)) + 1 >> 1;
  local_70.yp.m_i = (iVar5 - iVar12) - iVar17;
  iVar16 = iVar16 + iVar11 + 1;
  iVar18 = auVar22._8_4_ + 1;
  iVar11 = iVar18 - iVar16;
  if (((iVar18 < iVar16 + local_70.xp.m_i) || (iVar11 = local_70.xp.m_i, local_70.xp.m_i < iVar13))
     && (local_70.xp.m_i = iVar11, iVar11 <= iVar13)) {
    local_70.xp.m_i = iVar13;
  }
  iVar13 = auVar22._12_4_ + 1;
  iVar11 = iVar13 - (iVar12 + iVar14);
  if (((iVar13 < (iVar5 - iVar17) + iVar14) || (iVar11 = local_70.yp.m_i, local_70.yp.m_i < iVar4))
     && (local_70.yp.m_i = iVar4, iVar4 < iVar11)) {
    local_70.yp.m_i = iVar11;
  }
  if ((pQVar6 != (QScreen *)0x0) &&
     (pQVar10 = QWidget::windowHandle(&this->super_QWidget), pQVar10 != (QWindow *)0x0)) {
    QWindow::setScreen((QScreen *)pQVar10);
  }
  QWidget::move(&this->super_QWidget,&local_70);
  LOCK();
  _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
  UNLOCK();
  if (_DAT_aaaaaaaaaaaaaaaa == 0) {
    QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,8,0x10);
  }
LAB_004d96d6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialog::adjustPosition(QWidget* w)
{
    Q_D(QDialog);

    if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme())
        if (theme->themeHint(QPlatformTheme::WindowAutoPlacement).toBool())
            return;
    QPoint p(0, 0);
    int extraw = 0, extrah = 0;
    const QWindow *parentWindow = nullptr;
    if (w) {
        w = w->window();
    } else {
        parentWindow = d->transientParentWindow();
    }
    QRect desk;
    QScreen *scrn = nullptr;
    if (w)
        scrn = w->screen();
    else if (parentWindow)
        scrn = parentWindow->screen();
    else if (QGuiApplication::primaryScreen()->virtualSiblings().size() > 1)
        scrn = QGuiApplication::screenAt(QCursor::pos());
    else
        scrn = screen();
    if (scrn)
        desk = scrn->availableGeometry();

    QWidgetList list = QApplication::topLevelWidgets();
    for (int i = 0; (extraw == 0 || extrah == 0) && i < list.size(); ++i) {
        QWidget * current = list.at(i);
        if (current->isVisible()) {
            int framew = current->geometry().x() - current->x();
            int frameh = current->geometry().y() - current->y();

            extraw = qMax(extraw, framew);
            extrah = qMax(extrah, frameh);
        }
    }

    // sanity check for decoration frames. With embedding, we
    // might get extraordinary values
    if (extraw == 0 || extrah == 0 || extraw >= 10 || extrah >= 40) {
        extrah = 40;
        extraw = 10;
    }


    if (w) {
        // Use pos() if the widget is embedded into a native window
        QPoint pp;
        if (w->windowHandle() && qvariant_cast<WId>(w->windowHandle()->property("_q_embedded_native_parent_handle")))
            pp = w->pos();
        else
            pp = w->mapToGlobal(QPoint(0,0));
        p = QPoint(pp.x() + w->width()/2,
                    pp.y() + w->height()/ 2);
    } else if (parentWindow) {
        // QTBUG-63406: Widget-based dialog in QML, which has no Widget parent
        // but a transient parent window.
        QPoint pp = parentWindow->mapToGlobal(QPoint(0, 0));
        p = QPoint(pp.x() + parentWindow->width() / 2, pp.y() + parentWindow->height() / 2);
    } else {
        // p = middle of the desktop
        p = QPoint(desk.x() + desk.width()/2, desk.y() + desk.height()/2);
    }

    // p = origin of this
    p = QPoint(p.x()-width()/2 - extraw,
                p.y()-height()/2 - extrah);


    if (p.x() + extraw + width() > desk.x() + desk.width())
        p.setX(desk.x() + desk.width() - width() - extraw);
    if (p.x() < desk.x())
        p.setX(desk.x());

    if (p.y() + extrah + height() > desk.y() + desk.height())
        p.setY(desk.y() + desk.height() - height() - extrah);
    if (p.y() < desk.y())
        p.setY(desk.y());

    // QTBUG-52735: Manually set the correct target screen since scaling in a
    // subsequent call to QWindow::resize() may otherwise use the wrong factor
    // if the screen changed notification is still in an event queue.
    if (scrn) {
        if (QWindow *window = windowHandle())
            window->setScreen(scrn);
    }

    move(p);
}